

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O3

int SUNDlsMat_denseGEQRF(realtype **a,sunindextype m,sunindextype n,realtype *beta,realtype *v)

{
  double dVar1;
  realtype *prVar2;
  realtype *prVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  double __x;
  double dVar12;
  double dVar13;
  
  if (0 < n) {
    iVar4 = m + -1;
    lVar7 = (long)m;
    lVar9 = 0;
    uVar8 = 0;
    do {
      uVar10 = (ulong)(uint)m;
      prVar2 = a[uVar8];
      dVar1 = prVar2[uVar8];
      *v = 1.0;
      lVar11 = lVar7 - uVar8;
      uVar5 = uVar8;
      if (lVar11 < 2) {
LAB_004e2490:
        beta[uVar8] = 0.0;
      }
      else {
        dVar13 = 0.0;
        uVar6 = 1;
        do {
          dVar12 = *(double *)((long)prVar2 + uVar6 * 8 + lVar9);
          v[uVar6] = dVar12;
          dVar13 = dVar13 + dVar12 * dVar12;
          uVar6 = uVar6 + 1;
        } while (uVar10 != uVar6);
        if ((dVar13 == 0.0) && (!NAN(dVar13))) goto LAB_004e2490;
        __x = dVar1 * dVar1 + dVar13;
        dVar12 = 0.0;
        if (0.0 < __x) {
          if (__x < 0.0) {
            dVar12 = sqrt(__x);
          }
          else {
            dVar12 = SQRT(__x);
          }
        }
        dVar12 = (double)(-(ulong)(0.0 < dVar1) & (ulong)(-dVar13 / (dVar12 + dVar1)) |
                         ~-(ulong)(0.0 < dVar1) & (ulong)(dVar1 - dVar12));
        dVar1 = dVar12 * dVar12;
        beta[uVar8] = (dVar1 + dVar1) / (dVar13 + dVar1);
        if (1 < lVar11) {
          uVar6 = 1;
          do {
            v[uVar6] = v[uVar6] / dVar12;
            uVar6 = uVar6 + 1;
          } while (uVar10 != uVar6);
        }
      }
      do {
        if (0 < lVar11) {
          prVar3 = a[uVar5];
          dVar1 = 0.0;
          uVar6 = 0;
          do {
            dVar1 = dVar1 + *(double *)((long)prVar3 + uVar6 * 8 + lVar9) * v[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar10 != uVar6);
          if (0 < lVar11) {
            dVar13 = beta[uVar8];
            uVar6 = 0;
            do {
              *(double *)((long)prVar3 + uVar6 * 8 + lVar9) =
                   v[uVar6] * -dVar1 * dVar13 + *(double *)((long)prVar3 + uVar6 * 8 + lVar9);
              uVar6 = uVar6 + 1;
            } while (uVar10 != uVar6);
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 != (uint)n);
      if ((long)uVar8 < (long)iVar4 && 1 < lVar11) {
        uVar5 = 1;
        do {
          *(realtype *)((long)prVar2 + uVar5 * 8 + lVar9) = v[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar10 != uVar5);
      }
      uVar8 = uVar8 + 1;
      m = m - 1;
      lVar9 = lVar9 + 8;
    } while (uVar8 != (uint)n);
  }
  return 0;
}

Assistant:

int SUNDlsMat_denseGEQRF(realtype **a, sunindextype m, sunindextype n, realtype *beta, realtype *v)
{
  realtype ajj, s, mu, v1, v1_2;
  realtype *col_j, *col_k;
  sunindextype i, j, k;

  /* For each column...*/
  for(j=0; j<n; j++) {

    col_j = a[j];

    ajj = col_j[j];

    /* Compute the j-th Householder vector (of length m-j) */
    v[0] = ONE;
    s = ZERO;
    for(i=1; i<m-j; i++) {
      v[i] = col_j[i+j];
      s += v[i]*v[i];
    }

    if(s != ZERO) {
      mu = SUNRsqrt(ajj*ajj+s);
      v1 = (ajj <= ZERO) ? ajj-mu : -s/(ajj+mu);
      v1_2 = v1*v1;
      beta[j] = TWO * v1_2 / (s + v1_2);
      for(i=1; i<m-j; i++) v[i] /= v1;
    } else {
      beta[j] = ZERO;
    }

    /* Update upper triangle of A (load R) */
    for(k=j; k<n; k++) {
      col_k = a[k];
      s = ZERO;
      for(i=0; i<m-j; i++) s += col_k[i+j]*v[i];
      s *= beta[j];
      for(i=0; i<m-j; i++) col_k[i+j] -= s*v[i];
    }

    /* Update A (load Householder vector) */
    if(j<m-1) {
      for(i=1; i<m-j; i++) col_j[i+j] = v[i];
    }

  }


  return(0);
}